

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::ZeroCopyCodedInputStream::Next
          (ZeroCopyCodedInputStream *this,void **data,int *size)

{
  bool bVar1;
  int *size_local;
  void **data_local;
  ZeroCopyCodedInputStream *this_local;
  
  bVar1 = protobuf::io::CodedInputStream::GetDirectBufferPointer(this->cis_,data,size);
  if (bVar1) {
    protobuf::io::CodedInputStream::Skip(this->cis_,*size);
  }
  return bVar1;
}

Assistant:

bool Next(const void** data, int* size) final {
    if (!cis_->GetDirectBufferPointer(data, size)) return false;
    cis_->Skip(*size);
    return true;
  }